

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O0

bool slang::syntax::BinsSelectExpressionSyntax::isKind(SyntaxKind kind)

{
  SyntaxKind kind_local;
  bool local_1;
  
  if ((((kind == BinSelectWithFilterExpr) || (kind == BinaryBinsSelectExpr)) ||
      (kind == BinsSelectConditionExpr)) ||
     (((kind == ParenthesizedBinsSelectExpr || (kind == SimpleBinsSelectExpr)) ||
      (kind == UnaryBinsSelectExpr)))) {
    local_1 = true;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool BinsSelectExpressionSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::BinSelectWithFilterExpr:
        case SyntaxKind::BinaryBinsSelectExpr:
        case SyntaxKind::BinsSelectConditionExpr:
        case SyntaxKind::ParenthesizedBinsSelectExpr:
        case SyntaxKind::SimpleBinsSelectExpr:
        case SyntaxKind::UnaryBinsSelectExpr:
            return true;
        default:
            return false;
    }
}